

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c++
# Opt level: O3

Validity * __thiscall
kj::TestRunner::setFilter(Validity *__return_storage_ptr__,TestRunner *this,StringPtr pattern)

{
  char *__nptr;
  char *pcVar1;
  uint *puVar2;
  RemoveConst<unsigned_int> *pRVar3;
  uint *puVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  size_t sVar8;
  uint uVar9;
  uint uVar10;
  char *pcVar11;
  long lVar12;
  size_t sVar13;
  size_t sVar14;
  bool bVar15;
  ArrayPtr<const_char> pattern_00;
  StringPtr name;
  GlobFilter filter;
  GlobFilter local_68;
  
  this->hasFilter = true;
  sVar13 = pattern.content.size_ - 1;
  pcVar11 = pattern.content.ptr + pattern.content.size_;
  sVar14 = sVar13;
  do {
    bVar15 = sVar14 == 0;
    sVar14 = sVar14 - 1;
    if (bVar15) {
      uVar10 = 0xffffffff;
      uVar9 = 0;
      goto LAB_001a659a;
    }
    __nptr = pcVar11 + -1;
    pcVar1 = pcVar11 + -2;
    pcVar11 = __nptr;
  } while (*pcVar1 != ':');
  uVar6 = strtoul(__nptr,(char **)&local_68,0);
  uVar10 = 0xffffffff;
  uVar9 = 0;
  if (__nptr == local_68.pattern.content.ptr) goto LAB_001a659a;
  uVar5 = (uint)uVar6;
  if (*local_68.pattern.content.ptr != '\0') {
    if (*local_68.pattern.content.ptr != '-') goto LAB_001a659a;
    pcVar11 = local_68.pattern.content.ptr + 1;
    uVar7 = strtoul(pcVar11,(char **)&local_68,0);
    uVar9 = 0;
    if ((local_68.pattern.content.ptr <= pcVar11) ||
       (uVar9 = 0, uVar5 = (uint)uVar7, *local_68.pattern.content.ptr != '\0')) goto LAB_001a659a;
  }
  uVar10 = uVar5;
  sVar13 = sVar14;
  uVar9 = (uint)uVar6;
LAB_001a659a:
  pattern_00.size_ = sVar13;
  pattern_00.ptr = pattern.content.ptr;
  GlobFilter::GlobFilter(&local_68,pattern_00);
  if ((anonymous_namespace)::testCasesHead != 0) {
    lVar12 = (anonymous_namespace)::testCasesHead;
    do {
      if (*(char *)(lVar12 + 0x30) == '\0') {
        pcVar11 = *(char **)(lVar12 + 8);
        sVar8 = strlen(pcVar11);
        name.content.size_ = sVar8 + 1;
        name.content.ptr = pcVar11;
        bVar15 = GlobFilter::matches(&local_68,name);
        if (((bVar15) && (uVar9 <= *(uint *)(lVar12 + 0x10))) &&
           (*(uint *)(lVar12 + 0x10) <= uVar10)) {
          *(undefined1 *)(lVar12 + 0x30) = 1;
        }
      }
      lVar12 = *(long *)(lVar12 + 0x20);
    } while (lVar12 != 0);
  }
  puVar4 = local_68.states.builder.endPtr;
  pRVar3 = local_68.states.builder.pos;
  puVar2 = local_68.states.builder.ptr;
  (__return_storage_ptr__->errorMessage).ptr.isSet = false;
  if (local_68.states.builder.ptr != (uint *)0x0) {
    local_68.states.builder.ptr = (uint *)0x0;
    local_68.states.builder.pos = (RemoveConst<unsigned_int> *)0x0;
    local_68.states.builder.endPtr = (uint *)0x0;
    (**(local_68.states.builder.disposer)->_vptr_ArrayDisposer)
              (local_68.states.builder.disposer,puVar2,4,(long)pRVar3 - (long)puVar2 >> 2,
               (long)puVar4 - (long)puVar2 >> 2,0);
  }
  sVar13 = local_68.pattern.content.size_;
  pcVar11 = local_68.pattern.content.ptr;
  if (local_68.pattern.content.ptr != (char *)0x0) {
    local_68.pattern.content.ptr = (char *)0x0;
    local_68.pattern.content.size_ = 0;
    (**(local_68.pattern.content.disposer)->_vptr_ArrayDisposer)
              (local_68.pattern.content.disposer,pcVar11,1,sVar13,sVar13,0);
  }
  return __return_storage_ptr__;
}

Assistant:

MainBuilder::Validity setFilter(StringPtr pattern) {
    hasFilter = true;
    ArrayPtr<const char> filePattern = pattern;
    uint minLine = kj::minValue;
    uint maxLine = kj::maxValue;

    KJ_IF_SOME(colonPos, pattern.findLast(':')) {
      char* end;
      StringPtr lineStr = pattern.slice(colonPos + 1);

      bool parsedRange = false;
      minLine = strtoul(lineStr.cStr(), &end, 0);
      if (end != lineStr.begin()) {
        if (*end == '-') {
          // A range.
          const char* part2 = end + 1;
          maxLine = strtoul(part2, &end, 0);
          if (end > part2 && *end == '\0') {
            parsedRange = true;
          }
        } else if (*end == '\0') {
          parsedRange = true;
          maxLine = minLine;
        }
      }

      if (parsedRange) {
        // We have an exact line number.
        filePattern = pattern.first(colonPos);
      } else {
        // Can't parse as a number. Maybe the colon is part of a Windows path name or something.
        // Let's just keep it as part of the file pattern.
        minLine = kj::minValue;
        maxLine = kj::maxValue;
      }
    }

    kj::GlobFilter filter(filePattern);

    for (TestCase* testCase = testCasesHead; testCase != nullptr; testCase = testCase->next) {
      if (!testCase->matchedFilter && filter.matches(testCase->file) &&
          testCase->line >= minLine && testCase->line <= maxLine) {
        testCase->matchedFilter = true;
      }
    }

    return true;
  }